

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O1

Error asmjit::v1_14::InstAPI::queryRWInfo
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  Error EVar1;
  
  if (opCount < 7) {
    if ((byte)(arch - k32BitMask) < 2) {
      EVar1 = x86::InstInternal::queryRWInfo(arch,inst,operands,opCount,out);
      return EVar1;
    }
    if ((arch == kAArch64_BE) || (arch == kAArch64)) {
      EVar1 = a64::InstInternal::queryRWInfo(inst,operands,opCount,out);
      return EVar1;
    }
    EVar1 = 4;
  }
  else {
    EVar1 = 2;
  }
  return EVar1;
}

Assistant:

Error InstAPI::queryRWInfo(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  if (ASMJIT_UNLIKELY(opCount > Globals::kMaxOpCount))
    return DebugUtils::errored(kErrorInvalidArgument);

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::queryRWInfo(arch, inst, operands, opCount, out);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::queryRWInfo(inst, operands, opCount, out);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}